

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

ssize_t buffer_find(Buffer *buffer,size_t start,void *_data,size_t len)

{
  byte bVar1;
  uint8 *puVar2;
  size_t sVar3;
  int iVar4;
  ssize_t sVar5;
  ulong uVar6;
  void *__s1;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  BufferBlock *pBVar10;
  uint8 *__s;
  BufferBlock *pBVar11;
  void *__s2;
  ulong __n;
  uint local_5c;
  
  if (len == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = -1;
    if (len <= buffer->total_bytes - start && start < buffer->total_bytes) {
      pBVar10 = buffer->head;
      if (start == 0) {
        __s = pBVar10->data;
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        while (uVar6 = pBVar10->bytes + uVar8, uVar6 <= start) {
          pBVar10 = pBVar10->next;
          uVar8 = uVar6;
          if (pBVar10 == (BufferBlock *)0x0) {
            __assert_fail("item != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                          ,0x3d4,
                          "ssize_t buffer_find(Buffer *, const size_t, const void *, const size_t)")
            ;
          }
        }
        __s = pBVar10->data + (start - uVar8);
      }
      if (__s == (uint8 *)0x0) {
        __assert_fail("ptr != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                      ,0x3e2,
                      "ssize_t buffer_find(Buffer *, const size_t, const void *, const size_t)");
      }
      bVar1 = *_data;
      do {
        local_5c = (uint)bVar1;
        puVar2 = pBVar10->data;
        sVar3 = pBVar10->bytes;
        for (__s1 = memchr(__s,(uint)bVar1,(size_t)(puVar2 + (sVar3 - (long)__s)));
            __s1 != (void *)0x0;
            __s1 = memchr((void *)((long)__s1 + 1),local_5c,(sVar3 - lVar7) - 1)) {
          lVar7 = (long)__s1 - (long)puVar2;
          if (len == 1) {
LAB_0011f883:
            return lVar7 + uVar8;
          }
          uVar6 = sVar3 - lVar7;
          if (len <= sVar3 - lVar7) {
            uVar6 = len;
          }
          if ((sVar3 - lVar7 == 0) || (iVar4 = bcmp(__s1,_data,uVar6), iVar4 == 0)) {
            uVar9 = len - uVar6;
            if (uVar9 == 0) goto LAB_0011f883;
            pBVar11 = pBVar10->next;
            if (pBVar11 != (BufferBlock *)0x0) {
              __s2 = (void *)(uVar6 + (long)_data);
              do {
                uVar6 = pBVar11->bytes;
                __n = uVar6;
                if (uVar9 < uVar6) {
                  __n = uVar9;
                }
                iVar4 = bcmp(pBVar11->data,__s2,__n);
                if (iVar4 != 0) break;
                if (uVar9 <= uVar6) goto LAB_0011f883;
                uVar9 = uVar9 - __n;
                __s2 = (void *)((long)__s2 + __n);
                pBVar11 = pBVar11->next;
              } while (pBVar11 != (BufferBlock *)0x0);
            }
          }
        }
        pBVar10 = pBVar10->next;
        if (pBVar10 == (BufferBlock *)0x0) {
          __s = (uint8 *)0x0;
        }
        else {
          __s = pBVar10->data;
        }
        uVar8 = uVar8 + sVar3;
      } while (pBVar10 != (BufferBlock *)0x0);
      sVar5 = -1;
    }
  }
  return sVar5;
}

Assistant:

ssize_t buffer_find(Buffer *buffer, const size_t start,
                    const void *_data, const size_t len)
{
    if (len == 0)
        return 0;  // I guess that's right.

    if (start >= buffer->total_bytes)
        return -1;  // definitely can't match.

    if (len > (buffer->total_bytes - start))
        return -1;  // definitely can't match.

    // Find the start point somewhere in the center of a buffer.
    BufferBlock *item = buffer->head;
    const uint8 *ptr = item->data;
    size_t pos = 0;
    if (start > 0)
    {
        while (1)
        {
            assert(item != NULL);
            if ((pos + item->bytes) > start)  // start is in this block.
            {
                ptr = item->data + (start - pos);
                break;
            } // if

            pos += item->bytes;
            item = item->next;
        } // while
    } // if

    // okay, we're at the origin of the search.
    assert(item != NULL);
    assert(ptr != NULL);

    const uint8 *data = (const uint8 *) _data;
    const uint8 first = *data;
    while (item != NULL)
    {
        const size_t itemremain = item->bytes - ((size_t)(ptr-item->data));
        ptr = (uint8 *) memchr(ptr, first, itemremain);
        while (ptr != NULL)
        {
            const size_t retval = pos + ((size_t) (ptr - item->data));
            if (len == 1)
                return retval;  // we're done, here it is!

            const size_t itemremain = item->bytes - ((size_t)(ptr-item->data));
            const size_t avail = len < itemremain ? len : itemremain;
            if ((avail == 0) || (memcmp(ptr, data, avail) == 0))
            {
                // okay, we've got a (sub)string match! Move to the next block.
                // check all blocks until we get a complete match or a failure.
                if (blockscmp(item->next, data+avail, len-avail))
                    return (ssize_t) retval;
            } // if

            // try again, further in this block.
            ptr = (uint8 *) memchr(ptr + 1, first, itemremain - 1);
        } // while

        pos += item->bytes;
        item = item->next;
        if (item != NULL)
            ptr = item->data;
    } // while

    return -1;  // no match found.
}